

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O3

string * __thiscall
cmTimestamp::CurrentTime
          (string *__return_storage_ptr__,cmTimestamp *this,string *formatString,bool utcFlag)

{
  pointer pcVar1;
  time_t currentTimeT;
  string source_date_epoch;
  uv_timeval64_t timeval;
  istringstream iss;
  string local_228;
  cmTimestamp *local_208;
  string local_200;
  string local_1e0;
  uv_timeval64_t local_1c0;
  long local_1b0 [4];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_208 = this;
  uv_gettimeofday(&local_1c0);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&local_228);
  if (local_228._M_string_length != 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_228,_S_in);
    std::istream::_M_extract<long>(local_1b0);
    if ((*(uint *)((long)auStack_190 + *(long *)(local_1b0[0] + -0x18)) & 7) != 2) {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e0,"Cannot parse SOURCE_DATE_EPOCH as integer","");
      cmSystemTools::Error(&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      exit(0x1b);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
    local_1c0.tv_usec = 0;
  }
  if (local_1c0.tv_sec == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar1 = (formatString->_M_dataplus)._M_p;
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_200,pcVar1,pcVar1 + formatString->_M_string_length);
    CreateTimestampFromTimeT
              (__return_storage_ptr__,local_208,local_1c0.tv_sec,local_1c0.tv_usec,&local_200,
               utcFlag);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CurrentTime(const std::string& formatString,
                                     bool utcFlag) const
{
  // get current time with microsecond resolution
  uv_timeval64_t timeval;
  uv_gettimeofday(&timeval);
  auto currentTimeT = static_cast<time_t>(timeval.tv_sec);
  auto microseconds = static_cast<uint32_t>(timeval.tv_usec);

  // check for override via SOURCE_DATE_EPOCH for reproducible builds
  std::string source_date_epoch;
  cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
  if (!source_date_epoch.empty()) {
    std::istringstream iss(source_date_epoch);
    iss >> currentTimeT;
    if (iss.fail() || !iss.eof()) {
      cmSystemTools::Error("Cannot parse SOURCE_DATE_EPOCH as integer");
      exit(27);
    }
    // SOURCE_DATE_EPOCH has only a resolution in the seconds range
    microseconds = 0;
  }
  if (currentTimeT == static_cast<time_t>(-1)) {
    return std::string();
  }

  return this->CreateTimestampFromTimeT(currentTimeT, microseconds,
                                        formatString, utcFlag);
}